

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

reference __thiscall
slang::SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax*>::
emplace_back<slang::syntax::ConfigInstanceIdentifierSyntax*>
          (SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax*> *this,
          ConfigInstanceIdentifierSyntax **args)

{
  reference ppCVar1;
  ulong uVar2;
  SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax*> *__src;
  void *__dest;
  SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax*> *__src_00;
  long lVar3;
  ulong uVar4;
  
  lVar3 = *(long *)(this + 8);
  __src_00 = (SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax*> *)
             (lVar3 * 8 + *(long *)this);
  if (lVar3 != *(long *)(this + 0x10)) {
    *(ConfigInstanceIdentifierSyntax **)__src_00 = *args;
    *(long *)(this + 8) = lVar3 + 1;
    return (reference)(*(long *)this + lVar3 * 8);
  }
  if (*(long *)(this + 8) != 0xfffffffffffffff) {
    uVar4 = *(long *)(this + 8) + 1;
    uVar2 = *(ulong *)(this + 0x10);
    if (uVar4 < uVar2 * 2) {
      uVar4 = uVar2 * 2;
    }
    if (0xfffffffffffffff - uVar2 < uVar2) {
      uVar4 = 0xfffffffffffffff;
    }
    lVar3 = *(long *)this;
    __dest = operator_new(uVar4 * 8);
    ppCVar1 = (reference)((long)__dest + ((long)__src_00 - lVar3));
    *(ConfigInstanceIdentifierSyntax **)((long)__dest + ((long)__src_00 - lVar3)) = *args;
    __src = *(SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax*> **)this;
    lVar3 = *(long *)(this + 8);
    if (__src + (lVar3 * 8 - (long)__src_00) ==
        (SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax*> *)0x0) {
      if (lVar3 != 0) {
        memmove(__dest,__src,lVar3 * 8);
      }
    }
    else {
      if (__src != __src_00) {
        memmove(__dest,__src,(long)__src_00 - (long)__src);
      }
      memcpy(ppCVar1 + 1,__src_00,(size_t)(__src + (lVar3 * 8 - (long)__src_00)));
    }
    if (__src != this + 0x18) {
      operator_delete(__src);
      lVar3 = *(long *)(this + 8);
    }
    *(long *)(this + 8) = lVar3 + 1;
    *(ulong *)(this + 0x10) = uVar4;
    *(void **)this = __dest;
    return ppCVar1;
  }
  detail::throwLengthError();
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }